

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

void __thiscall
ProjectBuilderSources::ProjectBuilderSources
          (ProjectBuilderSources *this,QString *k,bool b,QString *c,bool o)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QString local_98;
  QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]> local_78;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->buildable = b;
  this->object_output = o;
  pDVar1 = (k->d).d;
  (this->key).d.d = pDVar1;
  (this->key).d.ptr = (k->d).ptr;
  (this->key).d.size = (k->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->group).d.d = (Data *)0x0;
  (this->group).d.ptr = (char16_t *)0x0;
  (this->group).d.size = 0;
  pDVar1 = (c->d).d;
  (this->compiler).d.d = pDVar1;
  (this->compiler).d.ptr = (c->d).ptr;
  (this->compiler).d.size = (c->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar5 = comparesEqual(k,"SOURCES");
  if (!bVar5) {
    bVar5 = comparesEqual(k,"OBJECTIVE_SOURCES");
    if (!bVar5) {
      bVar5 = comparesEqual(k,"HEADERS");
      if (!bVar5) {
        bVar5 = comparesEqual(k,"QMAKE_INTERNAL_INCLUDED_FILES");
        if (bVar5) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            pcVar6 = "Supporting Files";
            goto LAB_001418ea;
          }
          goto LAB_00141ac3;
        }
        bVar5 = comparesEqual(k,"GENERATED_SOURCES");
        if (!bVar5) {
          bVar5 = comparesEqual(k,"GENERATED_FILES");
          if (!bVar5) {
            bVar5 = comparesEqual(k,"RESOURCES");
            if (bVar5) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
                pcVar6 = "Resources";
                goto LAB_001418ea;
              }
            }
            else {
              if ((this->group).d.ptr == (char16_t *)0x0) {
                QString::QString(&local_98,"Sources [");
                local_78.a.a.d.size = local_98.d.size;
                local_78.a.a.d.ptr = local_98.d.ptr;
                local_78.a.a.d.d = local_98.d.d;
                local_98.d.size = 0;
                local_98.d.d = (Data *)0x0;
                local_98.d.ptr = (char16_t *)0x0;
                local_78.b = (char (*) [2])0x2b6395;
                local_78.a.b = c;
                QStringBuilder<QStringBuilder<QString,_const_QString_&>,_const_char_(&)[2]>::
                convertTo<QString>(&local_48,&local_78);
                pQVar2 = &((this->group).d.d)->super_QArrayData;
                pcVar3 = (this->group).d.ptr;
                (this->group).d.d = local_48.d.d;
                (this->group).d.ptr = local_48.d.ptr;
                qVar4 = (this->group).d.size;
                (this->group).d.size = local_48.d.size;
                local_48.d.d = (Data *)pQVar2;
                local_48.d.ptr = pcVar3;
                local_48.d.size = qVar4;
                if (pQVar2 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar2,2,0x10);
                  }
                }
                if (&(local_78.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       = ((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_78.a.a.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
                return;
              }
            }
            goto LAB_00141ac3;
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00141ac3;
        pcVar6 = "Generated Sources";
        goto LAB_001418ea;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00141ac3:
    __stack_chk_fail();
  }
  pcVar6 = "Sources";
LAB_001418ea:
  QVar7.m_size = (size_t)pcVar6;
  QVar7.field_0.m_data = &this->group;
  QString::assign(QVar7);
  return;
}

Assistant:

ProjectBuilderSources::ProjectBuilderSources(const QString &k, bool b, const QString &c, bool o) :
    buildable(b), object_output(o), key(k), compiler(c)
{
    // Override group name for a few common keys
    if (k == "SOURCES" || k == "OBJECTIVE_SOURCES" || k == "HEADERS")
        group = "Sources";
    else if (k == "QMAKE_INTERNAL_INCLUDED_FILES")
        group = "Supporting Files";
    else if (k == "GENERATED_SOURCES" || k == "GENERATED_FILES")
        group = "Generated Sources";
    else if (k == "RESOURCES")
        group = "Resources";
    else if (group.isNull())
        group = QString("Sources [") + c + "]";
}